

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O0

void test_mu_nthread(testing t)

{
  int iVar1;
  closure *cl;
  char *msg;
  nsync_time nVar2;
  nsync_time nVar3;
  undefined1 local_c8 [8];
  test_data td;
  int i;
  nsync_time deadline;
  int loop_count;
  testing t_local;
  
  deadline.tv_nsec._4_4_ = 100000;
  nVar2 = nsync::nsync_time_now();
  nVar3 = nsync::nsync_time_ms(0x5dc);
  nVar2 = nsync::nsync_time_add(nVar2,nVar3);
  do {
    memset(local_c8,0,0x68);
    td.t._0_4_ = 5;
    td.t._4_4_ = deadline.tv_nsec._4_4_;
    td._8_8_ = &td.unlock;
    td.mu_in_use = void_mu_lock;
    td.lock = void_mu_unlock;
    local_c8 = (undefined1  [8])t;
    for (td._100_4_ = 0; td._100_4_ != (int)td.t; td._100_4_ = td._100_4_ + 1) {
      cl = closure_counting(counting_loop,(closure_t_counting_0)local_c8,td._100_4_);
      closure_fork(cl);
    }
    test_data_wait_for_all_threads((test_data *)local_c8);
    if ((uint)td.rwmutex != (int)td.t * td.t._4_4_) {
      msg = smprintf("test_mu_nthread final count inconsistent: want %d, got %d",
                     (ulong)(uint)((int)td.t * td.t._4_4_),(ulong)(uint)td.rwmutex);
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/mu_test.c"
                     ,0x7e,msg);
    }
    deadline.tv_nsec._4_4_ = deadline.tv_nsec._4_4_ << 1;
    nVar3 = nsync::nsync_time_now();
    iVar1 = nsync::nsync_time_cmp(nVar3,nVar2);
  } while (iVar1 < 0);
  return;
}

Assistant:

static void test_mu_nthread (testing t) {
	int loop_count = 100000;
	nsync_time deadline;
	deadline = nsync_time_add (nsync_time_now (), nsync_time_ms (1500));
	do {
		int i;
		test_data td;
		memset ((void *) &td, 0, sizeof (td));
		td.t = t;
		td.n_threads = 5;
		td.loop_count = loop_count;
		td.mu_in_use = &td.mu;
		td.lock = &void_mu_lock;
		td.unlock = &void_mu_unlock;
		for (i = 0; i != td.n_threads; i++) {
			closure_fork (closure_counting (&counting_loop, &td, i));
		}
		test_data_wait_for_all_threads (&td);
		if (td.i != td.n_threads*td.loop_count) {
			TEST_FATAL (t, ("test_mu_nthread final count inconsistent: want %d, got %d",
				   td.n_threads*td.loop_count, td.i));
		}
		loop_count *= 2;
	} while (nsync_time_cmp (nsync_time_now (), deadline) < 0);
}